

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf.cpp
# Opt level: O1

ByteStream * __thiscall QPdf::ByteStream::operator<<(ByteStream *this,QPointF *p)

{
  long in_FS_OFFSET;
  char buf [256];
  char acStack_128 [264];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  memset(acStack_128,0xaa,0x100);
  qt_real_to_string(p->xp,acStack_128);
  operator<<(this,acStack_128);
  qt_real_to_string(p->yp,acStack_128);
  operator<<(this,acStack_128);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

ByteStream &ByteStream::operator <<(const QPointF &p) {
        char buf[256];
        qt_real_to_string(p.x(), buf);
        *this << buf;
        qt_real_to_string(p.y(), buf);
        *this << buf;
        return *this;
    }